

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall MarrayTest::copyConstructorTest<true>(MarrayTest *this)

{
  int iVar1;
  long lVar2;
  unsigned_long *puVar3;
  undefined8 uVar4;
  value_type *__val_1;
  reference piVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  size_t sVar7;
  size_t sVar8;
  reference piVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  logic_error *plVar11;
  code *pcVar12;
  value_type *__val_6;
  size_t sVar13;
  int iVar14;
  value_type *__val_5;
  undefined *puVar15;
  int *piVar16;
  value_type *__val;
  long lVar17;
  bool bVar18;
  Marray<int,_std::allocator<unsigned_long>_> n;
  Marray<int,_std::allocator<unsigned_long>_> m;
  int local_e4;
  unsigned_long *local_e0;
  undefined1 local_d8 [16];
  size_t *local_c8;
  size_t *local_c0;
  size_t *local_b8;
  size_t local_b0;
  size_t local_a8;
  CoordinateOrder local_a0;
  bool local_9c;
  Marray<int,_std::allocator<unsigned_long>_> local_90;
  int *local_48;
  MarrayTest *local_40;
  int *local_38;
  
  local_40 = this;
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&local_90,(allocator_type *)local_d8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
  operator_delete((void *)local_d8._0_8_,local_a8 << 2);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete((void *)CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_._4_4_,
                                   local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_._0_4_),
                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ <<
                  2);
  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_,
                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ * 0x18);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_90,&local_40->scalar_,&andres::defaultOrder,(allocator_type *)local_d8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
  if (CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._4_4_,
               local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_) == 0) {
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
  }
  else {
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ !=
          local_b0) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        pcVar12 = std::logic_error::~logic_error;
        puVar15 = &std::logic_error::typeinfo;
        goto LAB_001d7f80;
      }
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
          local_a8) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_e4 = 0;
      piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,&local_e4
                         );
      iVar14 = *piVar5;
      local_e4 = 0;
      piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,&local_e4);
      if (iVar14 != *piVar5) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      operator_delete((void *)local_d8._0_8_,local_a8 << 2);
      operator_delete(local_c8,local_b0 * 0x18);
      operator_delete((void *)CONCAT44(local_90.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>.data_.
                                       _4_4_,local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>.
                                             data_._0_4_),
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      _Var6._M_current = (unsigned_long *)operator_new(8);
      *_Var6._M_current = 0x18;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var6,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var6._M_current + 1),&local_40->scalar_,&andres::defaultOrder,
                 (allocator_type *)local_d8);
      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
          local_a8) {
LAB_001d7dc3:
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        pcVar12 = std::logic_error::~logic_error;
        puVar15 = &std::logic_error::typeinfo;
        goto LAB_001d8034;
      }
      if (CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._4_4_,
                   local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_) == 0
         ) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
      }
      else {
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_
              != local_b0) goto LAB_001d7dc3;
          iVar14 = 0;
          do {
            local_e4 = iVar14;
            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                &local_e4);
            iVar1 = *piVar5;
            local_e4 = iVar14;
            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,
                                &local_e4);
            if (iVar1 != *piVar5) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar11,"test failed.");
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0x18);
          operator_delete((void *)local_d8._0_8_,local_a8 << 2);
          operator_delete(local_c8,local_b0 * 0x18);
          operator_delete((void *)CONCAT44(local_90.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_._4_4_,
                                           local_90.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_._0_4_),
                          local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          operator_delete(_Var6._M_current,8);
          _Var6._M_current = (unsigned_long *)operator_new(0x10);
          *_Var6._M_current = 0;
          _Var6._M_current[1] = 0;
          *_Var6._M_current = 6;
          _Var6._M_current[1] = 4;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var6,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var6._M_current + 2),&local_40->scalar_,&andres::defaultOrder,
                     (allocator_type *)local_d8);
          andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
          if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
              local_a8) {
LAB_001d7df2:
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar11,"test failed.");
            pcVar12 = std::logic_error::~logic_error;
            puVar15 = &std::logic_error::typeinfo;
            goto LAB_001d8084;
          }
          if (CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._4_4_,
                       local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_)
              == 0) {
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          }
          else {
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ != local_b0) goto LAB_001d7df2;
              sVar13 = 0;
              do {
                iVar14 = 0;
                do {
                  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)&local_90,
                                      sVar13,iVar14);
                  iVar1 = *piVar5;
                  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)local_d8,
                                      sVar13,iVar14);
                  if (iVar1 != *piVar5) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar11,"test failed.");
                    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 != 4);
                sVar13 = sVar13 + 1;
              } while (sVar13 != 6);
              operator_delete((void *)local_d8._0_8_,local_a8 << 2);
              operator_delete(local_c8,local_b0 * 0x18);
              operator_delete((void *)CONCAT44(local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_._4_4_,
                                               local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_._0_4_),
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var6._M_current,0x10);
              local_48 = (int *)operator_new(0x18);
              *(unsigned_long *)local_48 = 0;
              *(unsigned_long *)((long)local_48 + 8) = 0;
              *(unsigned_long *)local_48 = 3;
              *(unsigned_long *)((long)local_48 + 8) = 4;
              *(unsigned_long *)((long)local_48 + 0x10) = 2;
              andres::Marray<int,std::allocator<unsigned_long>>::
              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_48,(unsigned_long *)((long)local_48 + 0x18),&local_40->scalar_,
                         &andres::defaultOrder,(allocator_type *)local_d8);
              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
              if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
                  local_a8) {
LAB_001d7e21:
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar11,"test failed.");
                pcVar12 = std::logic_error::~logic_error;
                puVar15 = &std::logic_error::typeinfo;
                goto LAB_001d80d4;
              }
              if (CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_.
                           _4_4_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_._0_4_) == 0) {
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
              }
              else {
                if ((pointer)local_d8._0_8_ != (pointer)0x0) {
                  if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ != local_b0) goto LAB_001d7e21;
                  lVar17 = 0;
                  do {
                    sVar13 = 0;
                    do {
                      iVar14 = 0;
                      do {
                        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                  (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>)
                        ;
                        lVar2 = CONCAT44(local_90.
                                         super_View<int,_false,_std::allocator<unsigned_long>_>.
                                         data_._4_4_,
                                         local_90.
                                         super_View<int,_false,_std::allocator<unsigned_long>_>.
                                         data_._0_4_);
                        if ((lVar2 == 0) ||
                           (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                            geometry_.dimension_ != 3)) {
                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar11,"Assertion failed.");
LAB_001d79b4:
                          pcVar12 = std::runtime_error::~runtime_error;
                          puVar15 = &std::runtime_error::typeinfo;
LAB_001d79c2:
                          __cxa_throw(plVar11,puVar15,pcVar12);
                        }
                        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          (&local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,0
                                          );
                        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                elementAccessHelper<int>
                                          (&local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,3
                                           ,sVar13,iVar14);
                        iVar1 = *(int *)(lVar2 + sVar7 * lVar17 * 4 + sVar8 * 4);
                        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                        uVar4 = local_d8._0_8_;
                        if (((pointer)local_d8._0_8_ == (pointer)0x0) || (local_b0 != 3)) {
                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar11,"Assertion failed.");
                          goto LAB_001d79b4;
                        }
                        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_d8,0);
                        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                elementAccessHelper<int>
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_d8,3,sVar13,iVar14);
                        if (iVar1 != *(int *)(uVar4 + (sVar7 * lVar17 + sVar8) * 4)) {
                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar11,"test failed.");
                          pcVar12 = std::logic_error::~logic_error;
                          puVar15 = &std::logic_error::typeinfo;
                          goto LAB_001d79c2;
                        }
                        iVar14 = iVar14 + 1;
                      } while (iVar14 == 1);
                      sVar13 = sVar13 + 1;
                    } while (sVar13 != 4);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  operator_delete((void *)local_d8._0_8_,local_a8 << 2);
                  operator_delete(local_c8,local_b0 * 0x18);
                  operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_ << 2);
                  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_,
                                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ * 0x18);
                  operator_delete(local_48,0x18);
                  local_d8._0_8_ = local_40;
                  local_c8 = (size_t *)operator_new(0);
                  local_b0 = 0;
                  local_a8 = 1;
                  local_a0 = LastMajorOrder;
                  local_9c = true;
                  local_c0 = local_c8;
                  local_b8 = local_c8;
                  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                  andres::Marray<int,std::allocator<unsigned_long>>::
                  Marray<int,true,std::allocator<unsigned_long>>
                            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                             (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                  if (local_a8 !=
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_) goto LAB_001d7cd8;
                  if ((MarrayTest *)local_d8._0_8_ == (MarrayTest *)0x0) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
                  }
                  else {
                    if (CONCAT44(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_._4_4_,
                                 local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_._0_4_) != 0) {
                      if (local_b0 ==
                          local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          dimension_) {
                        local_e4 = 0;
                        piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,true,std::allocator<unsigned_long>>
                                           ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                            local_d8,&local_e4);
                        iVar14 = *piVar9;
                        local_e4 = 0;
                        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,false,std::allocator<unsigned_long>>
                                           (&local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            &local_e4);
                        if (iVar14 == *piVar5) {
                          operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                          local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_ << 2);
                          operator_delete(local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shape_,
                                          local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ * 0x18);
                          operator_delete(local_c8,local_b0 * 0x18);
                          _Var6._M_current = (unsigned_long *)operator_new(8);
                          *_Var6._M_current = 0x18;
                          local_d8._0_8_ = local_40->data_;
                          local_48 = (int *)local_d8._0_8_;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var6
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var6._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_90);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                          andres::Marray<int,std::allocator<unsigned_long>>::
                          Marray<int,true,std::allocator<unsigned_long>>
                                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                          if (local_a8 !=
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_) {
LAB_001d7e50:
                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar11,"test failed.");
                            pcVar12 = std::logic_error::~logic_error;
                            puVar15 = &std::logic_error::typeinfo;
                            goto LAB_001d81a3;
                          }
                          if ((int *)local_d8._0_8_ == (int *)0x0) {
                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar11,"Assertion failed.");
                          }
                          else {
                            if (CONCAT44(local_90.
                                         super_View<int,_false,_std::allocator<unsigned_long>_>.
                                         data_._4_4_,
                                         local_90.
                                         super_View<int,_false,_std::allocator<unsigned_long>_>.
                                         data_._0_4_) != 0) {
                              if (local_b0 !=
                                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_) goto LAB_001d7e50;
                              iVar14 = 0;
                              do {
                                local_e4 = iVar14;
                                piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,true,std::allocator<unsigned_long>>
                                                   ((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_d8,&local_e4);
                                iVar1 = *piVar9;
                                local_e4 = iVar14;
                                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                if (iVar1 != *piVar5) {
                                  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar11,"test failed.");
                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                iVar14 = iVar14 + 1;
                              } while (iVar14 != 0x18);
                              operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.size_ << 2);
                              operator_delete(local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_c8,local_b0 * 0x18);
                              operator_delete(_Var6._M_current,8);
                              _Var6._M_current = (unsigned_long *)operator_new(8);
                              *_Var6._M_current = 6;
                              _Var10._M_current = (unsigned_long *)operator_new(8);
                              *_Var10._M_current = 4;
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_.
                              _0_4_ = 1;
                              local_d8._0_8_ = local_48;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                                         _Var6,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var6._M_current + 1),_Var10,
                                         (CoordinateOrder *)&local_90,(allocator_type *)&local_e4);
                              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8
                                        );
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              Marray<int,true,std::allocator<unsigned_long>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8
                                        );
                              iVar14 = 0;
                              piVar16 = local_48;
                              do {
                                local_e4 = iVar14;
                                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                if (*piVar5 != *piVar16) {
                                  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar11,"test failed.");
                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                iVar14 = iVar14 + 1;
                                piVar16 = piVar16 + 4;
                              } while (iVar14 != 6);
                              if ((int *)local_d8._0_8_ == (int *)0x0) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                              }
                              else {
                                if (CONCAT44(local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>.
                                             data_._4_4_,
                                             local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>.
                                             data_._0_4_) != 0) {
                                  if (local_b0 ==
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_) {
                                    local_e4 = 0;
                                    piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,true,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_e4);
                                    iVar14 = *piVar9;
                                    local_e4 = 0;
                                    piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                    if ((iVar14 == *piVar5) &&
                                       (local_a8 ==
                                        local_90.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_)) {
                                      operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                      operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                      operator_delete(local_c8,local_b0 * 0x18);
                                      operator_delete(_Var10._M_current,8);
                                      operator_delete(_Var6._M_current,8);
                                      _Var6._M_current = (unsigned_long *)operator_new(8);
                                      *_Var6._M_current = 6;
                                      _Var10._M_current = (unsigned_long *)operator_new(8);
                                      *_Var10._M_current = 4;
                                      piVar16 = local_40->data_ + 2;
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_.
                                      _0_4_ = 1;
                                      local_d8._0_8_ = piVar16;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_d8 + 8),_Var6,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),_Var10,
                                                 (CoordinateOrder *)&local_90,
                                                 (allocator_type *)&local_e4);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_d8);
                                      andres::Marray<int,std::allocator<unsigned_long>>::
                                      Marray<int,true,std::allocator<unsigned_long>>
                                                ((Marray<int,std::allocator<unsigned_long>> *)
                                                 &local_90,
                                                 (View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 local_d8);
                                      iVar14 = 0;
                                      do {
                                        local_e4 = iVar14;
                                        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                                 execute<int,int,false,std::allocator<unsigned_long>>
                                                           (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                        if (*piVar5 != *piVar16) {
                                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar11,"test failed.");
                                          __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                      std::logic_error::~logic_error);
                                        }
                                        iVar14 = iVar14 + 1;
                                        piVar16 = piVar16 + 4;
                                      } while (iVar14 != 6);
                                      if ((int *)local_d8._0_8_ == (int *)0x0) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                      }
                                      else {
                                        if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                          if (local_b0 ==
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_) {
                                            local_e4 = 0;
                                            piVar9 = andres::marray_detail::
                                                     AccessOperatorHelper<true>::
                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_e4);
                                            iVar14 = *piVar9;
                                            local_e4 = 0;
                                            piVar5 = andres::marray_detail::
                                                     AccessOperatorHelper<true>::
                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                            if ((iVar14 == *piVar5) &&
                                               (local_a8 ==
                                                local_90.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .geometry_.size_)) {
                                              operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                              operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                              operator_delete(local_c8,local_b0 * 0x18);
                                              operator_delete(_Var10._M_current,8);
                                              operator_delete(_Var6._M_current,8);
                                              _Var6._M_current = (unsigned_long *)operator_new(0x10)
                                              ;
                                              *_Var6._M_current = 0;
                                              _Var6._M_current[1] = 0;
                                              *_Var6._M_current = 6;
                                              _Var6._M_current[1] = 4;
                                              local_d8._0_8_ = local_48;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_d8 + 8),_Var6,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_90)
                                              ;
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              Marray<int,true,std::allocator<unsigned_long>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_90,
                                                         (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                              if (local_a8 !=
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001d7e7f:
                                                plVar11 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error
                                                          (plVar11,"test failed.");
                                                pcVar12 = std::logic_error::~logic_error;
                                                puVar15 = &std::logic_error::typeinfo;
                                                goto LAB_001d8293;
                                              }
                                              if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                plVar11 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar11,
                                                           "Assertion failed.");
                                              }
                                              else {
                                                if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                  if (local_b0 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001d7e7f;
                                                  sVar13 = 0;
                                                  do {
                                                    iVar14 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar13,iVar14);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar13,iVar14);
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 4);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 6);
                                                  operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 2;
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var10._M_current = 0;
                                                  _Var10._M_current[1] = 0;
                                                  *_Var10._M_current = 1;
                                                  _Var10._M_current[1] = 3;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_ = 1;
                                                  local_d8._0_8_ = local_48;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),_Var10,
                                                  (CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  local_e0 = _Var10._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  iVar14 = 0;
                                                  do {
                                                    sVar13 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar13,iVar14);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar13,iVar14);
                                                  puVar3 = local_e0;
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 3);
                                                  bVar18 = iVar14 == 0;
                                                  iVar14 = iVar14 + 1;
                                                  } while (bVar18);
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_e4 = 0;
                                                    piVar9 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_e4);
                                                  iVar14 = *piVar9;
                                                  local_e4 = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                                  if ((iVar14 == *piVar5) &&
                                                     (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_)) {
                                                    operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(puVar3,0x10);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 2;
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var10._M_current = 0;
                                                  _Var10._M_current[1] = 0;
                                                  *_Var10._M_current = 1;
                                                  _Var10._M_current[1] = 3;
                                                  local_d8._0_8_ = local_40->data100_ + 0x32;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_ = 1;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),_Var10,
                                                  (CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  local_e0 = _Var10._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  local_38 = local_40->data100_;
                                                  iVar14 = 0;
                                                  do {
                                                    sVar13 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar13,iVar14);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar13,iVar14);
                                                  puVar3 = local_e0;
                                                  if (iVar1 != *piVar5) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 3);
                                                  bVar18 = iVar14 == 0;
                                                  iVar14 = iVar14 + 1;
                                                  } while (bVar18);
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_e4 = 0;
                                                    piVar9 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_e4);
                                                  iVar14 = *piVar9;
                                                  local_e4 = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_e4);
                                                  if ((iVar14 == *piVar5) &&
                                                     (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_)) {
                                                    operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(puVar3,0x10);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_d8._0_8_ = local_48;
                                                  local_48 = (int *)_Var6._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_90)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001d7eae:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001d838d;
                                                  }
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                    if (local_b0 !=
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001d7eae;
                                                  lVar17 = 0;
                                                  do {
                                                    sVar13 = 0;
                                                    do {
                                                      iVar14 = 0;
                                                      do {
                                                        andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar4 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
LAB_001d7a30:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
LAB_001d7a3e:
                                                    __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar13,iVar14);
                                                  iVar1 = *(int *)(uVar4 + (sVar7 * lVar17 + sVar8)
                                                                           * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  lVar2 = CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_);
                                                  if ((lVar2 == 0) ||
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    goto LAB_001d7a30;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                  if (iVar1 != *(int *)(lVar2 + sVar7 * lVar17 * 4 +
                                                                       sVar8 * 4)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001d7a3e;
                                                  }
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 == 1);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 4);
                                                  lVar17 = lVar17 + 1;
                                                  } while (lVar17 != 3);
                                                  operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_48,0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_48 = (int *)_Var6._M_current;
                                                  local_e0 = (unsigned_long *)operator_new(0x18);
                                                  *local_e0 = 0;
                                                  local_e0[1] = 0;
                                                  *local_e0 = 2;
                                                  local_e0[1] = 10;
                                                  local_e0[2] = 0x23;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_ = 1;
                                                  local_d8._0_8_ = local_38;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_e0,(CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001d7edd:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001d83dd;
                                                  }
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                    if (local_b0 !=
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001d7edd;
                                                  iVar14 = 0;
                                                  do {
                                                    sVar13 = 0;
                                                    do {
                                                      lVar17 = 0;
                                                      do {
                                                        andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar4 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
LAB_001d7aac:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
LAB_001d7aba:
                                                    __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar13,iVar14);
                                                  iVar1 = *(int *)(uVar4 + (sVar7 * lVar17 + sVar8)
                                                                           * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  lVar2 = CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_);
                                                  if ((lVar2 == 0) ||
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    goto LAB_001d7aac;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                  if (iVar1 != *(int *)(sVar7 * lVar17 * 4 + lVar2 +
                                                                       sVar8 * 4)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001d7aba;
                                                  }
                                                  lVar17 = lVar17 + 1;
                                                  } while (lVar17 != 3);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 4);
                                                  bVar18 = iVar14 == 0;
                                                  iVar14 = iVar14 + 1;
                                                  } while (bVar18);
                                                  operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_e0,0x18);
                                                  operator_delete(local_48,0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 0;
                                                  _Var6._M_current[1] = 0;
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_48 = (int *)_Var6._M_current;
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var10._M_current = 0;
                                                  _Var10._M_current[1] = 0;
                                                  *_Var10._M_current = 2;
                                                  _Var10._M_current[1] = 10;
                                                  _Var10._M_current[2] = 0x23;
                                                  local_d8._0_8_ = local_40->data100_ + 0x1e;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_ = 1;
                                                  local_40 = (MarrayTest *)_Var10._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),_Var10,
                                                  (CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
                                                    if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                      plVar11 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar11,
                                                                 "Assertion failed.");
                                                    }
                                                    else {
                                                      if (CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_) != 0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    iVar14 = 0;
                                                    do {
                                                      sVar13 = 0;
                                                      do {
                                                        lVar17 = 0;
                                                        do {
                                                          andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar4 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
LAB_001d7b28:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar15 = &std::runtime_error::typeinfo;
LAB_001d7b36:
                                                    __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar13,iVar14);
                                                  iVar1 = *(int *)(uVar4 + (sVar7 * lVar17 + sVar8)
                                                                           * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  lVar2 = CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_);
                                                  if ((lVar2 == 0) ||
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    goto LAB_001d7b28;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar13,iVar14);
                                                  if (iVar1 != *(int *)(sVar7 * lVar17 * 4 + lVar2 +
                                                                       sVar8 * 4)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                    goto LAB_001d7b36;
                                                  }
                                                  lVar17 = lVar17 + 1;
                                                  } while (lVar17 != 3);
                                                  sVar13 = sVar13 + 1;
                                                  } while (sVar13 != 4);
                                                  bVar18 = iVar14 != 0;
                                                  iVar14 = iVar14 + 1;
                                                  if (bVar18) {
                                                    operator_delete((void *)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._0_4_),
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_48,0x18);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  goto LAB_001d80dc;
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
LAB_001d80dc:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar15 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001d83dd:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001d838d:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  goto LAB_001d8338;
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001d8338:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar15 = &std::logic_error::typeinfo;
                                                  goto LAB_001d82e3;
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar11,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar15 = &std::runtime_error::typeinfo;
LAB_001d82e3:
                                                  __cxa_throw(plVar11,puVar15,pcVar12);
                                                }
                                                plVar11 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar11,
                                                           "Assertion failed.");
                                              }
                                              pcVar12 = std::runtime_error::~runtime_error;
                                              puVar15 = &std::runtime_error::typeinfo;
LAB_001d8293:
                                              __cxa_throw(plVar11,puVar15,pcVar12);
                                            }
                                          }
                                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar11,"test failed.");
                                          pcVar12 = std::logic_error::~logic_error;
                                          puVar15 = &std::logic_error::typeinfo;
                                          goto LAB_001d8243;
                                        }
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                      }
                                      pcVar12 = std::runtime_error::~runtime_error;
                                      puVar15 = &std::runtime_error::typeinfo;
LAB_001d8243:
                                      __cxa_throw(plVar11,puVar15,pcVar12);
                                    }
                                  }
                                  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar11,"test failed.");
                                  pcVar12 = std::logic_error::~logic_error;
                                  puVar15 = &std::logic_error::typeinfo;
                                  goto LAB_001d81f3;
                                }
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                              }
                              pcVar12 = std::runtime_error::~runtime_error;
                              puVar15 = &std::runtime_error::typeinfo;
LAB_001d81f3:
                              __cxa_throw(plVar11,puVar15,pcVar12);
                            }
                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar11,"Assertion failed.");
                          }
                          pcVar12 = std::runtime_error::~runtime_error;
                          puVar15 = &std::runtime_error::typeinfo;
LAB_001d81a3:
                          __cxa_throw(plVar11,puVar15,pcVar12);
                        }
                      }
LAB_001d7cd8:
                      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar11,"test failed.");
                      pcVar12 = std::logic_error::~logic_error;
                      puVar15 = &std::logic_error::typeinfo;
                      goto LAB_001d8153;
                    }
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
                  }
                  pcVar12 = std::runtime_error::~runtime_error;
                  puVar15 = &std::runtime_error::typeinfo;
LAB_001d8153:
                  __cxa_throw(plVar11,puVar15,pcVar12);
                }
                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
              }
              pcVar12 = std::runtime_error::~runtime_error;
              puVar15 = &std::runtime_error::typeinfo;
LAB_001d80d4:
              __cxa_throw(plVar11,puVar15,pcVar12);
            }
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          }
          pcVar12 = std::runtime_error::~runtime_error;
          puVar15 = &std::runtime_error::typeinfo;
LAB_001d8084:
          __cxa_throw(plVar11,puVar15,pcVar12);
        }
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
      }
      pcVar12 = std::runtime_error::~runtime_error;
      puVar15 = &std::runtime_error::typeinfo;
LAB_001d8034:
      __cxa_throw(plVar11,puVar15,pcVar12);
    }
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
  }
  pcVar12 = std::runtime_error::~runtime_error;
  puVar15 = &std::runtime_error::typeinfo;
LAB_001d7f80:
  __cxa_throw(plVar11,puVar15,pcVar12);
}

Assistant:

void MarrayTest::copyConstructorTest() {
    // contruction from a Marray
    {
        // empty 
        {
            andres::Marray<int> m;
            andres::Marray<int> n(m);
        }
        // scalar
        {
            andres::Marray<int> m(scalar_);
            andres::Marray<int> n(m);

            test(m.dimension() == n.dimension());
            test(m.size() == n.size());
            test(m(0) == n(0));
        }
        // 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 24; ++x)
                test(m(x)==n(x));
        }
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 6; ++x){
                for(int y = 0; y < 4; ++y)
                    test(m(x, y)==n(x, y));
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 3; ++x){
                for(int y = 0; y < 4; ++y){
                    for(int z = 0; z < 2; ++z)
                        test(m(x, y, z)==n(x, y, z));
                }
            }
        }
    }
    // contruction from a view
    {
        // scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            andres::Marray<int> m(v);
            test(v.size()==m.size() &&
                   v.dimension()==m.dimension() &&
                   v(0)==m(0));
        }
        // View is 1D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 0; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_+2, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 2; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 2D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+50, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 3D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x)
                for(int y = 0; y < 4; ++y)
                for(int z = 0; z < 2; ++z){
                    test(v(x, y, z)==m(x, y, z));
                    
                }
            }
            // with strides and without offset
            {        
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
            // with strides and offset
            {       
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+30, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
        }
    }
}